

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

string * __thiscall
MADPComponentDiscreteStates::SoftPrintStates_abi_cxx11_(MADPComponentDiscreteStates *this)

{
  bool bVar1;
  reference pSVar2;
  string *in_RDI;
  const_iterator last;
  const_iterator it;
  stringstream ss;
  vector<StateDiscrete,_std::allocator<StateDiscrete>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  string *this_00;
  string local_1c8 [32];
  StateDiscrete *local_1a8;
  __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
  local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  this_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0._M_current =
       (StateDiscrete *)
       std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::begin(in_stack_fffffffffffffdf8);
  local_1a8 = (StateDiscrete *)
              std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::end
                        (in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    in_stack_fffffffffffffe00 = local_188;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
             ::operator*(&local_1a0);
    (*(pSVar2->super_State).super_NamedDescribedEntity._vptr_NamedDescribedEntity[2])(local_1c8);
    std::operator<<(in_stack_fffffffffffffe00,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
    ::operator++((__normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
                  *)this_00,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MADPComponentDiscreteStates::SoftPrintStates() const
{    
    stringstream ss;
    vector<StateDiscrete>::const_iterator it = _m_stateVec.begin();
    vector<StateDiscrete>::const_iterator last = _m_stateVec.end();
    while(it!=last)
    {
        ss << (*it).SoftPrint();
        ss << endl;
        it++;
    }
    return(ss.str());
}